

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlrecode.cpp
# Opt level: O1

void ensureDetached(QString *result,char16_t **output,char16_t *begin,char16_t *input,char16_t *end,
                   int add)

{
  char16_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  if (*output != (char16_t *)0x0) {
    return;
  }
  iVar4 = (int)(result->d).size;
  QString::resize(result,(long)(int)((int)((ulong)((long)end - (long)begin) >> 1) +
                                     ((int)end - (int)input & 0xfffffffeU) + add + iVar4));
  pcVar1 = (result->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = L"";
  }
  pcVar1 = pcVar1 + iVar4;
  *output = pcVar1;
  uVar3 = (uint)((ulong)((long)input - (long)begin) >> 1);
  if ((int)uVar3 < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      pcVar1[uVar2] = begin[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar2);
    uVar2 = uVar2 & 0xffffffff;
  }
  *output = pcVar1 + uVar2;
  return;
}

Assistant:

static void ensureDetached(QString &result, char16_t *&output, const char16_t *begin, const char16_t *input, const char16_t *end,
                           int add = 0)
{
    if (!output) {
        // now detach
        // create enough space if the rest of the string needed to be percent-encoded
        int charsProcessed = input - begin;
        int charsRemaining = end - input;
        int spaceNeeded = end - begin + 2 * charsRemaining + add;
        int origSize = result.size();
        result.resize(origSize + spaceNeeded);

        // we know that resize() above detached, so we bypass the reference count check
        output = const_cast<char16_t *>(reinterpret_cast<const char16_t *>(result.constData()))
                 + origSize;

        // copy the chars we've already processed
        int i;
        for (i = 0; i < charsProcessed; ++i)
            output[i] = begin[i];
        output += i;
    }
}